

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void __thiscall
fe::operations::op_blend_one_invSrcAlpha::operator()
          (op_blend_one_invSrcAlpha *this,PixelB8G8R8A8 *srcPixelFormat,
          PixelDISTANCE *destPixelFormat,uchar *srcData,uchar *destData,int x,int y)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  Pixel d;
  Pixel local_1c;
  
  bVar1 = srcData[3];
  PixelDISTANCE::getPixel(destPixelFormat,destData,&local_1c,x,y);
  uVar3 = ((uint)local_1c.field_0.field_0.bytes[3] * (uint)(byte)~bVar1) / 0xff + (uint)bVar1;
  uVar2 = (uchar)uVar3;
  if (0xfe < uVar3) {
    uVar2 = 0xff;
  }
  *destData = uVar2;
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel s;
                srcPixelFormat.getPixel(srcData, s, OPERATOR_ARGS_PASS);

                Pixel d;
                destPixelFormat.getPixel(destData, d, OPERATOR_ARGS_PASS);

#define M(v) v < 255 ? v : 255;
                unsigned char ia = 255 - s.a;
                Pixel r;
                r.r = M((d.r * ia) / 255 + s.r);
                r.g = M((d.g * ia) / 255 + s.g);
                r.b = M((d.b * ia) / 255 + s.b);
                r.a = M((d.a * ia) / 255 + s.a);
#undef  M

                destPixelFormat.setPixel(destData, r);
            }